

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

string * __thiscall
helics::CommonCore::getSourceTargets_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  byte bVar1;
  pair<helics::route_id,_helics::ActionMessage> *ppVar2;
  FederateState *pFVar3;
  InputInfo *this_00;
  InputInfo *pIVar4;
  
  ppVar2 = getHandleInfo(this,handle);
  if (ppVar2 == (pair<helics::route_id,_helics::ActionMessage> *)0x0) goto LAB_002fc83d;
  bVar1 = (byte)(ppVar2->second).messageID;
  if (bVar1 < 0x69) {
    if (bVar1 != 0x65) {
      if (bVar1 != 0x66) {
        return (string *)&gEmptyString_abi_cxx11_;
      }
      goto LAB_002fc83d;
    }
LAB_002fc810:
    pFVar3 = getFederateAt(this,(LocalFederateId)(ppVar2->second).messageAction);
    this_00 = (InputInfo *)InterfaceInfo::getEndpoint(&pFVar3->interfaceInformation,handle);
    pIVar4 = this_00;
    if (this_00 != (InputInfo *)0x0) {
      pIVar4 = (InputInfo *)EndpointInfo::getSourceTargets_abi_cxx11_((EndpointInfo *)this_00);
    }
  }
  else {
    if (bVar1 == 0x73) goto LAB_002fc810;
    if (bVar1 != 0x69) {
      return (string *)&gEmptyString_abi_cxx11_;
    }
    pFVar3 = getFederateAt(this,(LocalFederateId)(ppVar2->second).messageAction);
    this_00 = InterfaceInfo::getInput(&pFVar3->interfaceInformation,handle);
    pIVar4 = this_00;
    if (this_00 != (InputInfo *)0x0) {
      pIVar4 = (InputInfo *)InputInfo::getTargets_abi_cxx11_(this_00);
    }
  }
  if (this_00 != (InputInfo *)0x0) {
    return (string *)pIVar4;
  }
LAB_002fc83d:
  return (string *)&gEmptyString_abi_cxx11_;
}

Assistant:

const std::string& CommonCore::getSourceTargets(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::INPUT: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* inpInfo = fed->interfaces().getInput(handle);
                if (inpInfo != nullptr) {
                    return inpInfo->getTargets();
                }
                break;
            }
            case InterfaceType::PUBLICATION:
                return gEmptyString;
            case InterfaceType::ENDPOINT:
            case InterfaceType::SINK: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* eptInfo = fed->interfaces().getEndpoint(handle);
                if (eptInfo != nullptr) {
                    return eptInfo->getSourceTargets();
                }
                break;
            }
            case InterfaceType::FILTER: {
                break;
            }
            default:
                return gEmptyString;
        }
    }
    return gEmptyString;
}